

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
::initialize_slots(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                   *this)

{
  allocator_type *alloc;
  size_t n;
  char *p;
  CopyConst<char,_ElementType<0UL>_> *pCVar1;
  CopyConst<char,_ElementType<1UL>_>_conflict3 *pCVar2;
  char *mem;
  Layout layout;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  *this_local;
  
  if (this->capacity_ != 0) {
    if (this->slots_ == (slot_type *)0x0) {
      Sample();
    }
    _mem = (size_t  [2])MakeLayout(this->capacity_);
    alloc = alloc_ref(this);
    n = internal_layout::
        LayoutImpl<std::tuple<signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::shared_ptr<ThreadState>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
        ::AllocSize((LayoutImpl<std::tuple<signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::shared_ptr<ThreadState>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)&mem);
    p = (char *)Allocate<8ul,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
                          (alloc,n);
    pCVar1 = internal_layout::
             LayoutImpl<std::tuple<signed_char,phmap::container_internal::map_slot_type<unsigned_long,std::shared_ptr<ThreadState>>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<0ul,char>((LayoutImpl<std::tuple<signed_char,phmap::container_internal::map_slot_type<unsigned_long,std::shared_ptr<ThreadState>>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&mem,p);
    this->ctrl_ = pCVar1;
    pCVar2 = internal_layout::
             LayoutImpl<std::tuple<signed_char,phmap::container_internal::map_slot_type<unsigned_long,std::shared_ptr<ThreadState>>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<1ul,char>((LayoutImpl<std::tuple<signed_char,phmap::container_internal::map_slot_type<unsigned_long,std::shared_ptr<ThreadState>>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&mem,p);
    this->slots_ = pCVar2;
    reset_ctrl(this);
    reset_growth_left(this);
    HashtablezInfoHandle::RecordStorageChanged
              ((HashtablezInfoHandle *)&this->field_0x20,this->size_,this->capacity_);
    return;
  }
  __assert_fail("capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x70a,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::initialize_slots() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
               );
}

Assistant:

void initialize_slots() {
        assert(capacity_);
        if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value && 
            slots_ == nullptr) {
            infoz_ = Sample();
        }

        auto layout = MakeLayout(capacity_);
        char* mem = static_cast<char*>(
            Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
        ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
        slots_ = layout.template Pointer<1>(mem);
        reset_ctrl();
        reset_growth_left();
        infoz_.RecordStorageChanged(size_, capacity_);
    }